

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  FastWriter *this_local;
  
  ~FastWriter(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~FastWriter() JSONCPP_OVERRIDE {}